

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          float *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  uint uVar26;
  int iVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  lVar31 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  if (0 < lVar31) {
    pfVar28 = (this->super_BeagleCPUImpl<float,_1,_0>).gTransitionMatrices[firstDerivativeIndex];
    uVar26 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
    iVar27 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
    pfVar29 = (this->super_BeagleCPUImpl<float,_1,_0>).grandDenominatorDerivTmp;
    pfVar30 = (this->super_BeagleCPUImpl<float,_1,_0>).grandNumeratorDerivTmp;
    lVar34 = 0;
    lVar35 = 0;
    iVar32 = 0;
    do {
      if (0 < (int)uVar26) {
        fVar1 = categoryWeights[lVar34];
        fVar2 = pfVar28[lVar35];
        fVar3 = pfVar28[lVar35 + 1];
        fVar4 = pfVar28[lVar35 + 2];
        fVar5 = pfVar28[lVar35 + 3];
        fVar6 = pfVar28[lVar35 + 5];
        fVar7 = pfVar28[lVar35 + 6];
        fVar8 = pfVar28[lVar35 + 7];
        fVar9 = pfVar28[lVar35 + 8];
        fVar10 = pfVar28[lVar35 + 10];
        fVar11 = pfVar28[lVar35 + 0xb];
        fVar12 = pfVar28[lVar35 + 0xc];
        fVar13 = pfVar28[lVar35 + 0xd];
        fVar14 = pfVar28[lVar35 + 0xf];
        fVar15 = pfVar28[lVar35 + 0x10];
        fVar16 = pfVar28[lVar35 + 0x11];
        fVar17 = pfVar28[lVar35 + 0x12];
        lVar33 = 0;
        do {
          fVar18 = postOrderPartial[iVar32 + lVar33];
          fVar19 = postOrderPartial[(long)iVar32 + lVar33 + 1];
          fVar20 = postOrderPartial[(long)iVar32 + lVar33 + 2];
          fVar21 = postOrderPartial[(long)iVar32 + lVar33 + 3];
          fVar22 = preOrderPartial[iVar32 + lVar33];
          fVar23 = preOrderPartial[(long)iVar32 + lVar33 + 1];
          fVar24 = preOrderPartial[(long)iVar32 + lVar33 + 2];
          fVar25 = preOrderPartial[(long)iVar32 + lVar33 + 3];
          auVar36 = vmulss_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)fVar19));
          auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar2),ZEXT416((uint)fVar18));
          auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar4),ZEXT416((uint)fVar20));
          auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar5),ZEXT416((uint)fVar21));
          auVar37 = vmulss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)fVar19));
          auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)fVar6),ZEXT416((uint)fVar18));
          auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)fVar8),ZEXT416((uint)fVar20));
          auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)fVar9),ZEXT416((uint)fVar21));
          auVar40 = ZEXT416((uint)fVar19);
          auVar38 = vmulss_avx512f(ZEXT416((uint)fVar11),auVar40);
          auVar41 = ZEXT416((uint)fVar18);
          auVar38 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)fVar10),auVar41);
          auVar42 = ZEXT416((uint)fVar20);
          auVar38 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)fVar12),auVar42);
          auVar43 = ZEXT416((uint)fVar21);
          auVar38 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)fVar13),auVar43);
          auVar39 = vmulss_avx512f(ZEXT416((uint)fVar15),auVar40);
          auVar39 = vfmadd231ss_avx512f(auVar39,ZEXT416((uint)fVar14),auVar41);
          auVar39 = vfmadd231ss_avx512f(auVar39,ZEXT416((uint)fVar16),auVar42);
          auVar39 = vfmadd231ss_avx512f(auVar39,ZEXT416((uint)fVar17),auVar43);
          auVar40 = vmulss_avx512f(auVar40,ZEXT416((uint)fVar23));
          auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar22),auVar41);
          auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar24),auVar42);
          auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar25),auVar43);
          auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar1),
                                        ZEXT416(*(uint *)((long)pfVar29 + lVar33)));
          *(int *)((long)pfVar29 + lVar33) = auVar40._0_4_;
          auVar37 = vmulss_avx512f(auVar37,ZEXT416((uint)fVar23));
          auVar36 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)fVar22),auVar36);
          auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar24),auVar38);
          auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar25),auVar39);
          auVar36 = vfmadd213ss_avx512f(auVar36,ZEXT416((uint)fVar1),
                                        ZEXT416(*(uint *)((long)pfVar30 + lVar33)));
          *(int *)((long)pfVar30 + lVar33) = auVar36._0_4_;
          lVar33 = lVar33 + 4;
        } while ((ulong)uVar26 << 2 != lVar33);
      }
      lVar35 = lVar35 + 0x14;
      lVar34 = lVar34 + 1;
      iVar32 = iVar32 + iVar27 * 4;
    } while (lVar34 != lVar31);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                             const REALTYPE *preOrderPartial,
                                                                             const int firstDerivativeIndex,
                                                                             const int secondDerivativeIndex,
                                                                             const double *categoryRates,
                                                                             const REALTYPE *categoryWeights,
                                                                             const int scalingFactorsIndex,
                                                                             double *outDerivatives,
                                                                             double *outSumDerivatives,
                                                                             double *outSumSquaredDerivatives) {

    const REALTYPE* transMatrix = gTransitionMatrices[firstDerivativeIndex];

    int w = 0;
    for(int l = 0; l < kCategoryCount; l++) {

        int v = l*kPaddedPatternCount*4;

        const REALTYPE weight = categoryWeights[l];

        PREFETCH_MATRIX(1,transMatrix,w); // TODO Use _TRANSPOSE and then reverse integration below

        for(int k = 0; k < kPatternCount; k++) {

            PREFETCH_PARTIALS(1, postOrderPartial,v);
            PREFETCH_PARTIALS(0, preOrderPartial, v);


            DO_INTEGRATION(1);

//            grandNumeratorDerivTmp[k] += (sum10 * prePartials[v] + sum11 * prePartials[v + 1]
//                    + sum12 * prePartials[v + 2] + sum13 * prePartials[v + 3]) * weight;
//            grandDenominatorDerivTmp[k] += (postPartials[v] * prePartials[v] + postPartials[v + 1] * prePartials[v + 1]
//                    + postPartials[v + 2] * prePartials[v + 2] + postPartials[v + 3] * prePartials[v + 3]) * weight;

            grandDenominatorDerivTmp[k] += (p10 * p00 + p11 * p01 + p12 * p02 + p13 * p03) * weight;
            grandNumeratorDerivTmp[k] += (sum10 * p00 + sum11 * p01 + sum12 * p02 + sum13 * p03) * weight;

            v += 4;
        }
        w += OFFSET*4;
    }
}